

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtestcase.cpp
# Opt level: O2

void QTest::qtest_qParseArgs(int argc,char **argv,bool qml)

{
  qsizetype qVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  Mode MVar4;
  QBenchmarkGlobalData *pQVar5;
  char cVar6;
  bool bVar7;
  int iVar8;
  long lVar9;
  size_t sVar10;
  char *filename;
  char *__s1;
  undefined1 *puVar11;
  char *pcVar12;
  int iVar13;
  long in_FS_OFFSET;
  bool bVar14;
  QByteArrayView QVar15;
  QByteArrayView QVar16;
  size_t sStack_b0;
  LogMode local_9c;
  char *local_88;
  QByteArrayView local_78;
  QByteArrayView local_68;
  QArrayDataPointer<char16_t> local_58;
  char *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  repetitions = 1;
  QList<QString>::clear((QList<QString> *)testFunctions);
  QList<QString>::clear((QList<QString> *)testTags);
  iVar13 = 1;
  local_88 = (char *)0x0;
  local_9c = ~Plain;
LAB_00128133:
  if (argc <= iVar13) {
    QTestResult::currentAppName();
    QTestResult::currentTestObjectName();
    QTestLog::setInstalledTestCoverage(false);
    bVar14 = local_9c != ~Plain;
    bVar7 = QTestLog::hasLoggers();
    if (!bVar7 && bVar14 || !bVar14) {
      if (bVar7 || !bVar14) {
        local_9c = Plain;
      }
      QTestLog::addLogger(local_9c,local_88);
    }
    if ((repetitions == 1) || (bVar7 = QTestLog::isRepeatSupported(), bVar7)) {
      if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
        __stack_chk_fail();
      }
      return;
    }
    pcVar12 = "-repeat is only supported with plain text logger\n";
    sStack_b0 = 0x31;
LAB_00128c4e:
    fwrite(pcVar12,sStack_b0,1,_stderr);
    exit(1);
  }
  pcVar12 = argv[iVar13];
  iVar8 = strcmp(pcVar12,"-help");
  if (((iVar8 == 0) || (iVar8 = strcmp(pcVar12,"--help"), iVar8 == 0)) ||
     ((cVar6 = *pcVar12, cVar6 == '/' && ((pcVar12[1] == '?' && (pcVar12[2] == '\0')))))) {
    printf(" Usage: %s [options] [testfunction[:testdata]]...\n    By default, all testfunctions will be run.\n\n%s"
           ,*argv,
           " New-style logging options:\n -o filename,format  : Output results to file in the specified format\n                       Use - to output to stdout\n                       Valid formats are:\n                         txt      : Plain text\n                         csv      : CSV format (suitable for benchmarks)\n                         junitxml : XML JUnit document\n                         xml      : XML document\n                         lightxml : A stream of XML tags\n                         teamcity : TeamCity format\n                         tap      : Test Anything Protocol\n\n     *** Multiple loggers can be specified, but at most one can log to stdout.\n\n Old-style logging options:\n -o filename         : Write the output into file\n -txt                : Output results in Plain Text\n -csv                : Output results in a CSV format (suitable for benchmarks)\n -junitxml           : Output results as XML JUnit document\n -xml                : Output results as XML document\n -lightxml           : Output results as stream of XML tags\n -teamcity           : Output results in TeamCity format\n -tap                : Output results in Test Anything Protocol format\n\n     *** If no output file is specified, stdout is assumed.\n     *** If no output format is specified, -txt is assumed.\n\n Test log detail options:\n -silent             : Log failures and fatal errors only\n -v1                 : Log the start of each testfunction\n -v2                 : Log each QVERIFY/QCOMPARE/QTEST (implies -v1)\n -vs                 : Log every signal emission and resulting slot invocations\n\n     *** The -silent and -v1 options only affect plain text output.\n\n Testing options:\n -functions          : Returns a list of current testfunctions\n -datatags           : Returns a list of current data tags.\n                       A global data tag is preceded by \' __global__ \'.\n -eventdelay ms      : Set default delay for mouse and keyboard simulation to ms milliseconds\n -keydelay ms        : Set default delay for keyboard simulation to ms milliseconds\n..." /* TRUNCATED STRING LITERAL */
          );
    if (qml) {
      puts(
          "\n QmlTest options:\n -import dir         : Specify an import directory.\n -plugins dir        : Specify a directory where to search for plugins.\n -input dir/file     : Specify the root directory for test cases or a single test case file.\n -translation file   : Specify the translation file.\n -file-selector dir  : Specify a file selector for the QML engine."
          );
    }
    puts("\n -help               : This help");
LAB_00128c09:
    exit(0);
  }
  iVar8 = strcmp(pcVar12,"-functions");
  if (iVar8 == 0) {
    if (!qml) {
      qPrintTestSlots(_stdout,(char *)0x0,"");
      goto LAB_00128c09;
    }
    puVar11 = &printAvailableFunctions;
LAB_001284f8:
    *puVar11 = 1;
  }
  else {
    iVar8 = strcmp(pcVar12,"-datatags");
    if (iVar8 == 0) {
      if (!qml) {
        qPrintDataTags(_stdout);
        goto LAB_00128c09;
      }
    }
    else {
      iVar8 = strcmp(pcVar12,"-txt");
      if (iVar8 == 0) {
        local_9c = Plain;
      }
      else {
        iVar8 = strcmp(pcVar12,"-csv");
        if (iVar8 == 0) {
          local_9c = CSV;
        }
        else {
          iVar8 = strcmp(pcVar12,"-junitxml");
          if (iVar8 != 0) {
            iVar8 = strcmp(pcVar12,"-xunitxml");
            if (iVar8 != 0) {
              iVar8 = strcmp(pcVar12,"-xml");
              if (iVar8 == 0) {
                local_9c = XML;
              }
              else {
                iVar8 = strcmp(pcVar12,"-lightxml");
                if (iVar8 == 0) {
                  local_9c = LightXML;
                }
                else {
                  iVar8 = strcmp(pcVar12,"-teamcity");
                  if (iVar8 == 0) {
                    local_9c = TeamCity;
                  }
                  else {
                    iVar8 = strcmp(pcVar12,"-tap");
                    if (iVar8 != 0) {
                      iVar8 = strcmp(pcVar12,"-silent");
                      if (iVar8 == 0) {
                        iVar8 = -1;
                      }
                      else {
                        iVar8 = strcmp(pcVar12,"-v1");
                        if (iVar8 == 0) {
                          iVar8 = 1;
                        }
                        else {
                          iVar8 = strcmp(pcVar12,"-v2");
                          if (iVar8 != 0) {
                            iVar8 = strcmp(pcVar12,"-vs");
                            if (iVar8 == 0) {
                              QSignalDumper::setEnabled(true);
                            }
                            else {
                              if (((cVar6 == '-') && (pcVar12[1] == 'o')) && (pcVar12[2] == '\0')) {
                                iVar13 = iVar13 + 1;
                                if (iVar13 < argc) {
                                  pcVar12 = argv[iVar13];
                                  sVar10 = strlen(pcVar12);
                                  filename = (char *)operator_new__(sVar10 + 1);
                                  sVar10 = strlen(pcVar12);
                                  __s1 = (char *)operator_new__(sVar10 + 1);
                                  iVar8 = __isoc99_sscanf(pcVar12,"%[^,],%s",filename,__s1);
                                  if (iVar8 == 1) {
                                    local_88 = argv[iVar13];
                                  }
                                  else {
                                    iVar8 = strcmp(__s1,"txt");
                                    if (iVar8 == 0) {
                                      local_9c = Plain;
                                    }
                                    else {
                                      iVar8 = strcmp(__s1,"csv");
                                      local_9c = CSV;
                                      if (iVar8 != 0) {
                                        iVar8 = strcmp(__s1,"lightxml");
                                        local_9c = LightXML;
                                        if (iVar8 != 0) {
                                          iVar8 = strcmp(__s1,"xml");
                                          local_9c = XML;
                                          if (iVar8 != 0) {
                                            iVar8 = strcmp(__s1,"junitxml");
                                            local_9c = JUnitXML;
                                            if (iVar8 != 0) {
                                              iVar8 = strcmp(__s1,"xunitxml");
                                              if (iVar8 == 0) {
                                                fwrite(
                                                  "WARNING: xunitxml is deprecated. Please use junitxml.\n"
                                                  ,0x36,1,_stderr);
                                                local_9c = JUnitXML;
                                              }
                                              else {
                                                iVar8 = strcmp(__s1,"teamcity");
                                                local_9c = TeamCity;
                                                if (iVar8 != 0) {
                                                  iVar8 = strcmp(__s1,"tap");
                                                  local_9c = TAP;
                                                  if (iVar8 != 0) {
                                                    pcVar12 = 
                                                  "output format must be one of txt, csv, lightxml, xml, tap, teamcity or junitxml\n"
                                                  ;
                                                  sStack_b0 = 0x50;
                                                  goto LAB_00128c4e;
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                    if (((*filename == '-') && (filename[1] == '\0')) &&
                                       (bVar7 = QTestLog::loggerUsingStdout(), bVar7)) {
                                      pcVar12 = "only one logger can log to stdout\n";
                                      sStack_b0 = 0x22;
                                      goto LAB_00128c4e;
                                    }
                                    QTestLog::addLogger(local_9c,filename);
                                  }
                                  operator_delete__(filename);
                                  operator_delete__(__s1);
                                  goto LAB_00128550;
                                }
                                pcVar12 = 
                                "-o needs an extra parameter specifying the filename and optional format\n"
                                ;
LAB_00128d0a:
                                sStack_b0 = 0x48;
                                goto LAB_00128c4e;
                              }
                              iVar8 = strcmp(pcVar12,"-eventdelay");
                              if (iVar8 == 0) {
                                iVar13 = iVar13 + 1;
                                if (argc <= iVar13) {
                                  pcVar12 = 
                                  "-eventdelay needs an extra parameter to indicate the delay(ms)\n"
                                  ;
LAB_00128d3a:
                                  sStack_b0 = 0x3f;
                                  goto LAB_00128c4e;
                                }
                                eventDelay = qToInt(argv[iVar13]);
                              }
                              else {
                                iVar8 = strcmp(pcVar12,"-keydelay");
                                if (iVar8 == 0) {
                                  iVar13 = iVar13 + 1;
                                  if (argc <= iVar13) {
                                    pcVar12 = 
                                    "-keydelay needs an extra parameter to indicate the delay(ms)\n"
                                    ;
                                    sStack_b0 = 0x3d;
                                    goto LAB_00128c4e;
                                  }
                                  keyDelay = qToInt(argv[iVar13]);
                                }
                                else {
                                  iVar8 = strcmp(pcVar12,"-mousedelay");
                                  if (iVar8 == 0) {
                                    iVar13 = iVar13 + 1;
                                    if (argc <= iVar13) {
                                      pcVar12 = 
                                      "-mousedelay needs an extra parameter to indicate the delay(ms)\n"
                                      ;
                                      goto LAB_00128d3a;
                                    }
                                    mouseDelay = qToInt(argv[iVar13]);
                                  }
                                  else {
                                    iVar8 = strcmp(pcVar12,"-maxwarnings");
                                    if (iVar8 == 0) {
                                      iVar13 = iVar13 + 1;
                                      if (argc <= iVar13) {
                                        pcVar12 = 
                                        "-maxwarnings needs an extra parameter with the amount of warnings\n"
                                        ;
                                        sStack_b0 = 0x42;
                                        goto LAB_00128c4e;
                                      }
                                      iVar8 = qToInt(argv[iVar13]);
                                      QTestLog::setMaxWarnings(iVar8);
                                    }
                                    else {
                                      iVar8 = strcmp(pcVar12,"-repeat");
                                      if (iVar8 == 0) {
                                        iVar13 = iVar13 + 1;
                                        if (argc <= iVar13) {
                                          pcVar12 = 
                                          "-repeat needs an extra parameter for the number of repetitions\n"
                                          ;
                                          goto LAB_00128d3a;
                                        }
                                        repetitions = qToInt(argv[iVar13]);
                                      }
                                      else {
                                        iVar8 = strcmp(pcVar12,"-nocrashhandler");
                                        if (iVar8 == 0) {
                                          puVar11 = &Internal::noCrashHandler;
                                          goto LAB_001284f8;
                                        }
                                        iVar8 = strcmp(pcVar12,"-skipblacklisted");
                                        if (iVar8 == 0) {
                                          skipBlacklisted = 1;
                                        }
                                        else {
                                          iVar8 = strcmp(pcVar12,"-callgrind");
                                          if (iVar8 == 0) {
                                            bVar7 = QBenchmarkValgrindUtils::haveValgrind();
                                            if (bVar7) {
                                              QDir::currentPath();
                                              QFileInfo::QFileInfo
                                                        ((QFileInfo *)&local_40,(QString *)&local_58
                                                        );
                                              cVar6 = QFileInfo::isWritable();
                                              QFileInfo::~QFileInfo((QFileInfo *)&local_40);
                                              QArrayDataPointer<char16_t>::~QArrayDataPointer
                                                        (&local_58);
                                              if (cVar6 != '\0') {
                                                MVar4 = CallgrindParentProcess;
                                                goto LAB_001288c8;
                                              }
                                              pcVar12 = 
                                              "WARNING: Current directory not writable. Using the walltime measurer.\n"
                                              ;
                                              sStack_b0 = 0x46;
LAB_001289f4:
                                              fwrite(pcVar12,sStack_b0,1,_stderr);
                                            }
                                            else {
                                              fwrite(
                                                  "WARNING: Valgrind not found or too old. Make sure it is installed and in your path. Using the walltime measurer.\n"
                                                  ,0x71,1,_stderr);
                                            }
                                          }
                                          else {
                                            iVar8 = strcmp(pcVar12,"-callgrindchild");
                                            if (iVar8 == 0) {
                                              QBenchmarkGlobalData::setMode
                                                        (QBenchmarkGlobalData::current,
                                                         CallgrindChildProcess);
                                              QBenchmarkValgrindUtils::outFileBase
                                                        ((QString *)&local_58,-1);
                                              pQVar5 = QBenchmarkGlobalData::current;
                                              pDVar2 = (QBenchmarkGlobalData::current->
                                                       callgrindOutFileBase).d.d;
                                              pcVar3 = (QBenchmarkGlobalData::current->
                                                       callgrindOutFileBase).d.ptr;
                                              (QBenchmarkGlobalData::current->callgrindOutFileBase).
                                              d.d = local_58.d;
                                              (pQVar5->callgrindOutFileBase).d.ptr = local_58.ptr;
                                              qVar1 = (pQVar5->callgrindOutFileBase).d.size;
                                              (pQVar5->callgrindOutFileBase).d.size = local_58.size;
                                              local_58.d = pDVar2;
                                              local_58.ptr = pcVar3;
                                              local_58.size = qVar1;
LAB_001288a2:
                                              QArrayDataPointer<char16_t>::~QArrayDataPointer
                                                        (&local_58);
                                            }
                                            else {
                                              iVar8 = strcmp(pcVar12,"-perf");
                                              if (iVar8 == 0) {
                                                bVar7 = QBenchmarkPerfEventsMeasurer::isAvailable();
                                                if (!bVar7) {
                                                  pcVar12 = 
                                                  "WARNING: Linux perf events not available. Using the walltime measurer.\n"
                                                  ;
                                                  sStack_b0 = 0x47;
                                                  goto LAB_001289f4;
                                                }
                                                MVar4 = PerfCounter;
LAB_001288c8:
                                                QBenchmarkGlobalData::setMode
                                                          (QBenchmarkGlobalData::current,MVar4);
                                              }
                                              else {
                                                iVar8 = strcmp(pcVar12,"-perfcounter");
                                                if (iVar8 == 0) {
                                                  iVar13 = iVar13 + 1;
                                                  if (argc <= iVar13) {
                                                    pcVar12 = 
                                                  "-perfcounter needs an extra parameter with the name of the counter\n"
                                                  ;
                                                  sStack_b0 = 0x43;
                                                  goto LAB_00128c4e;
                                                  }
                                                  QBenchmarkPerfEventsMeasurer::setCounter
                                                            (argv[iVar13]);
                                                }
                                                else {
                                                  iVar8 = strcmp(pcVar12,"-perfcounterlist");
                                                  if (iVar8 == 0) {
                                                    QBenchmarkPerfEventsMeasurer::listCounters();
                                                    goto LAB_00128c09;
                                                  }
                                                  iVar8 = strcmp(pcVar12,"-tickcounter");
                                                  if (iVar8 == 0) {
                                                    MVar4 = TickCounter;
                                                  }
                                                  else {
                                                    iVar8 = strcmp(pcVar12,"-eventcounter");
                                                    if (iVar8 != 0) {
                                                      iVar8 = strcmp(pcVar12,"-minimumvalue");
                                                      if (iVar8 == 0) {
                                                        iVar13 = iVar13 + 1;
                                                        if (argc <= iVar13) {
                                                          pcVar12 = 
                                                  "-minimumvalue needs an extra parameter to indicate the minimum time(ms)\n"
                                                  ;
                                                  goto LAB_00128d0a;
                                                  }
                                                  iVar8 = qToInt(argv[iVar13]);
                                                  QBenchmarkGlobalData::current->walltimeMinimum =
                                                       iVar8;
                                                  }
                                                  else {
                                                    iVar8 = strcmp(pcVar12,"-minimumtotal");
                                                    if (iVar8 == 0) {
                                                      iVar13 = iVar13 + 1;
                                                      if (argc <= iVar13) {
                                                        pcVar12 = 
                                                  "-minimumtotal needs an extra parameter to indicate the minimum total measurement\n"
                                                  ;
                                                  sStack_b0 = 0x51;
                                                  goto LAB_00128c4e;
                                                  }
                                                  iVar8 = qToInt(argv[iVar13]);
                                                  QBenchmarkGlobalData::current->minimumTotal =
                                                       iVar8;
                                                  }
                                                  else {
                                                    iVar8 = strcmp(pcVar12,"-iterations");
                                                    if (iVar8 == 0) {
                                                      iVar13 = iVar13 + 1;
                                                      if (iVar13 < argc) {
                                                        iVar8 = qToInt(argv[iVar13]);
                                                        QBenchmarkGlobalData::current->
                                                        iterationCount = iVar8;
                                                        goto LAB_00128550;
                                                      }
                                                      pcVar12 = 
                                                  "-iterations needs an extra parameter to indicate the number of iterations\n"
                                                  ;
                                                  sStack_b0 = 0x4a;
                                                  goto LAB_00128c4e;
                                                  }
                                                  iVar8 = strcmp(pcVar12,"-median");
                                                  if (iVar8 == 0) {
                                                    iVar13 = iVar13 + 1;
                                                    if (argc <= iVar13) {
                                                      pcVar12 = 
                                                  "-median needs an extra parameter to indicate the number of median iterations\n"
                                                  ;
                                                  sStack_b0 = 0x4d;
                                                  goto LAB_00128c4e;
                                                  }
                                                  iVar8 = qToInt(argv[iVar13]);
                                                  QBenchmarkGlobalData::current->
                                                  medianIterationCount = iVar8;
                                                  }
                                                  else {
                                                    iVar8 = strcmp(pcVar12,"-vb");
                                                    if (iVar8 != 0) {
                                                      if (cVar6 != '-') {
                                                        lVar9 = 0;
LAB_001284b5:
                                                        iVar8 = (int)lVar9;
                                                        if (cVar6 != ':') {
                                                          if (cVar6 == '\0') goto LAB_00128aec;
LAB_001284da:
                                                          cVar6 = pcVar12[(long)iVar8 + 1];
                                                          lVar9 = (long)iVar8 + 1;
                                                          goto LAB_001284b5;
                                                        }
                                                        lVar9 = (long)iVar8;
                                                        if (pcVar12[lVar9 + 1] == ':') {
                                                          iVar8 = iVar8 + 1;
                                                          goto LAB_001284da;
                                                        }
                                                        if (iVar8 != -1) {
                                                          QString::fromLatin1((QString *)&local_58,
                                                                              pcVar12,lVar9);
                                                          QList<QString>::emplaceBack<QString>
                                                                    ((QList<QString> *)testFunctions
                                                                     ,(QString *)&local_58);
                                                          QArrayDataPointer<char16_t>::
                                                          ~QArrayDataPointer(&local_58);
                                                          local_40 = argv[iVar13] + lVar9 + 1;
                                                          QByteArrayView::
                                                          QByteArrayView<const_char_*,_true>
                                                                    (&local_78,&local_40);
                                                          QVar15.m_data =
                                                               (storage_type *)local_78.m_size;
                                                          QVar15.m_size = (qsizetype)&local_58;
                                                          QString::fromLatin1(QVar15);
                                                          QList<QString>::emplaceBack<QString>
                                                                    ((QList<QString> *)testTags,
                                                                     (QString *)&local_58);
                                                          goto LAB_001288a2;
                                                        }
LAB_00128aec:
                                                        QByteArrayView::
                                                        QByteArrayView<const_char_*,_true>
                                                                  (&local_68,argv + iVar13);
                                                        QVar16.m_data =
                                                             (storage_type *)local_68.m_size;
                                                        QVar16.m_size = (qsizetype)&local_58;
                                                        QString::fromLatin1(QVar16);
                                                        QList<QString>::emplaceBack<QString>
                                                                  ((QList<QString> *)testFunctions,
                                                                   (QString *)&local_58);
                                                        QArrayDataPointer<char16_t>::
                                                        ~QArrayDataPointer(&local_58);
                                                        local_58.d = (Data *)0x0;
                                                        local_58.ptr = (char16_t *)0x0;
                                                        local_58.size = 0;
                                                        QList<QString>::emplaceBack<QString>
                                                                  ((QList<QString> *)testTags,
                                                                   (QString *)&local_58);
                                                        goto LAB_001288a2;
                                                      }
                                                      fprintf(_stderr,"Unknown option: \'%s\'\n\n%s"
                                                              ,pcVar12,
                                                  " New-style logging options:\n -o filename,format  : Output results to file in the specified format\n                       Use - to output to stdout\n                       Valid formats are:\n                         txt      : Plain text\n                         csv      : CSV format (suitable for benchmarks)\n                         junitxml : XML JUnit document\n                         xml      : XML document\n                         lightxml : A stream of XML tags\n                         teamcity : TeamCity format\n                         tap      : Test Anything Protocol\n\n     *** Multiple loggers can be specified, but at most one can log to stdout.\n\n Old-style logging options:\n -o filename         : Write the output into file\n -txt                : Output results in Plain Text\n -csv                : Output results in a CSV format (suitable for benchmarks)\n -junitxml           : Output results as XML JUnit document\n -xml                : Output results as XML document\n -lightxml           : Output results as stream of XML tags\n -teamcity           : Output results in TeamCity format\n -tap                : Output results in Test Anything Protocol format\n\n     *** If no output file is specified, stdout is assumed.\n     *** If no output format is specified, -txt is assumed.\n\n Test log detail options:\n -silent             : Log failures and fatal errors only\n -v1                 : Log the start of each testfunction\n -v2                 : Log each QVERIFY/QCOMPARE/QTEST (implies -v1)\n -vs                 : Log every signal emission and resulting slot invocations\n\n     *** The -silent and -v1 options only affect plain text output.\n\n Testing options:\n -functions          : Returns a list of current testfunctions\n -datatags           : Returns a list of current data tags.\n                       A global data tag is preceded by \' __global__ \'.\n -eventdelay ms      : Set default delay for mouse and keyboard simulation to ms milliseconds\n -keydelay ms        : Set default delay for keyboard simulation to ms milliseconds\n..." /* TRUNCATED STRING LITERAL */
                                                  );
                                                  if (qml) {
                                                    fwrite(
                                                  "\nqmltest related options:\n -import    : Specify an import directory.\n -plugins   : Specify a directory where to search for plugins.\n -input     : Specify the root directory for test cases.\n"
                                                  ,0xbd,1,_stderr);
                                                  }
                                                  pcVar12 = "\n -help      : This help\n";
                                                  sStack_b0 = 0x19;
                                                  goto LAB_00128c4e;
                                                  }
                                                  QBenchmarkGlobalData::current->verboseOutput =
                                                       true;
                                                  }
                                                  }
                                                  }
                                                  goto LAB_00128550;
                                                  }
                                                  MVar4 = EventCounter;
                                                  }
                                                  QBenchmarkGlobalData::setMode
                                                            (QBenchmarkGlobalData::current,MVar4);
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                            goto LAB_00128550;
                          }
                          iVar8 = 2;
                        }
                      }
                      QTestLog::setVerboseLevel(iVar8);
                      goto LAB_00128550;
                    }
                    local_9c = TAP;
                  }
                }
              }
              goto LAB_00128550;
            }
            fwrite("WARNING: xunitxml is deprecated. Please use junitxml.\n",0x36,1,_stderr);
          }
          local_9c = JUnitXML;
        }
      }
    }
  }
LAB_00128550:
  iVar13 = iVar13 + 1;
  goto LAB_00128133;
}

Assistant:

Q_TESTLIB_EXPORT void qtest_qParseArgs(int argc, const char *const argv[], bool qml)
{
    int logFormat = -1; // Not set
    const char *logFilename = nullptr;

    repetitions = 1;

    QTest::testFunctions.clear();
    QTest::testTags.clear();

#if defined(Q_OS_DARWIN) && defined(HAVE_XCTEST)
    if (QXcodeTestLogger::canLogTestProgress())
        logFormat = QTestLog::XCTest;
#endif

    const char *testOptions =
         " New-style logging options:\n"
         " -o filename,format  : Output results to file in the specified format\n"
         "                       Use - to output to stdout\n"
         "                       Valid formats are:\n"
         "                         txt      : Plain text\n"
         "                         csv      : CSV format (suitable for benchmarks)\n"
         "                         junitxml : XML JUnit document\n"
         "                         xml      : XML document\n"
         "                         lightxml : A stream of XML tags\n"
         "                         teamcity : TeamCity format\n"
         "                         tap      : Test Anything Protocol\n"
         "\n"
         "     *** Multiple loggers can be specified, but at most one can log to stdout.\n"
         "\n"
         " Old-style logging options:\n"
         " -o filename         : Write the output into file\n"
         " -txt                : Output results in Plain Text\n"
         " -csv                : Output results in a CSV format (suitable for benchmarks)\n"
         " -junitxml           : Output results as XML JUnit document\n"
         " -xml                : Output results as XML document\n"
         " -lightxml           : Output results as stream of XML tags\n"
         " -teamcity           : Output results in TeamCity format\n"
         " -tap                : Output results in Test Anything Protocol format\n"
         "\n"
         "     *** If no output file is specified, stdout is assumed.\n"
         "     *** If no output format is specified, -txt is assumed.\n"
         "\n"
         " Test log detail options:\n"
         " -silent             : Log failures and fatal errors only\n"
         " -v1                 : Log the start of each testfunction\n"
         " -v2                 : Log each QVERIFY/QCOMPARE/QTEST (implies -v1)\n"
         " -vs                 : Log every signal emission and resulting slot invocations\n"
         "\n"
         "     *** The -silent and -v1 options only affect plain text output.\n"
         "\n"
         " Testing options:\n"
         " -functions          : Returns a list of current testfunctions\n"
         " -datatags           : Returns a list of current data tags.\n"
         "                       A global data tag is preceded by ' __global__ '.\n"
         " -eventdelay ms      : Set default delay for mouse and keyboard simulation to ms milliseconds\n"
         " -keydelay ms        : Set default delay for keyboard simulation to ms milliseconds\n"
         " -mousedelay ms      : Set default delay for mouse simulation to ms milliseconds\n"
         " -maxwarnings n      : Sets the maximum amount of messages to output.\n"
         "                       0 means unlimited, default: 2000\n"
         " -nocrashhandler     : Disables the crash handler. Useful for debugging crashes.\n"
         " -repeat n           : Run the testsuite n times or until the test fails.\n"
         "                       Useful for finding flaky tests. If negative, the tests are\n"
         "                       repeated forever. This is intended as a developer tool, and\n"
         "                       is only supported with the plain text logger.\n"
         " -skipblacklisted    : Skip blacklisted tests. Useful for measuring test coverage.\n"
         "\n"
         " Benchmarking options:\n"
#if QT_CONFIG(valgrind)
         " -callgrind          : Use callgrind to time benchmarks\n"
#endif
#ifdef QTESTLIB_USE_PERF_EVENTS
         " -perf               : Use Linux perf events to time benchmarks\n"
         " -perfcounter name   : Use the counter named 'name'\n"
         " -perfcounterlist    : Lists the counters available\n"
#endif
#ifdef HAVE_TICK_COUNTER
         " -tickcounter        : Use CPU tick counters to time benchmarks\n"
#endif
         " -eventcounter       : Counts events received during benchmarks\n"
         " -minimumvalue n     : Sets the minimum acceptable measurement value\n"
         " -minimumtotal n     : Sets the minimum acceptable total for repeated executions of a test function\n"
         " -iterations  n      : Sets the number of accumulation iterations.\n"
         " -median  n          : Sets the number of median iterations.\n"
         " -vb                 : Print out verbose benchmarking information.\n";

    for (int i = 1; i < argc; ++i) {
        if (strcmp(argv[i], "-help") == 0 || strcmp(argv[i], "--help") == 0
            || strcmp(argv[i], "/?") == 0) {
            std::printf(" Usage: %s [options] [testfunction[:testdata]]...\n"
                        "    By default, all testfunctions will be run.\n\n"
                        "%s", argv[0], testOptions);

            if (qml) {
                std::printf("\n"
                            " QmlTest options:\n"
                            " -import dir         : Specify an import directory.\n"
                            " -plugins dir        : Specify a directory where to search for plugins.\n"
                            " -input dir/file     : Specify the root directory for test cases or a single test case file.\n"
                            " -translation file   : Specify the translation file.\n"
                            " -file-selector dir  : Specify a file selector for the QML engine.\n");
            }

            std::printf("\n"
                        " -help               : This help\n");
            exit(0);
        } else if (strcmp(argv[i], "-functions") == 0) {
            if (qml) {
                QTest::printAvailableFunctions = true;
            } else {
                qPrintTestSlots(stdout);
                exit(0);
            }
        } else if (strcmp(argv[i], "-datatags") == 0) {
            if (!qml) {
                qPrintDataTags(stdout);
                exit(0);
            }
        } else if (strcmp(argv[i], "-txt") == 0) {
            logFormat = QTestLog::Plain;
        } else if (strcmp(argv[i], "-csv") == 0) {
            logFormat = QTestLog::CSV;
        } else if (strcmp(argv[i], "-junitxml") == 0)  {
            logFormat = QTestLog::JUnitXML;
        } else if (strcmp(argv[i], "-xunitxml") == 0)  {
            std::fprintf(stderr, "WARNING: xunitxml is deprecated. Please use junitxml.\n");
            logFormat = QTestLog::JUnitXML;
        } else if (strcmp(argv[i], "-xml") == 0) {
            logFormat = QTestLog::XML;
        } else if (strcmp(argv[i], "-lightxml") == 0) {
            logFormat = QTestLog::LightXML;
        } else if (strcmp(argv[i], "-teamcity") == 0) {
            logFormat = QTestLog::TeamCity;
        } else if (strcmp(argv[i], "-tap") == 0) {
            logFormat = QTestLog::TAP;
        } else if (strcmp(argv[i], "-silent") == 0) {
            QTestLog::setVerboseLevel(-1);
        } else if (strcmp(argv[i], "-v1") == 0) {
            QTestLog::setVerboseLevel(1);
        } else if (strcmp(argv[i], "-v2") == 0) {
            QTestLog::setVerboseLevel(2);
        } else if (strcmp(argv[i], "-vs") == 0) {
            QSignalDumper::setEnabled(true);
        } else if (strcmp(argv[i], "-o") == 0) {
            if (i + 1 >= argc) {
                std::fprintf(stderr, "-o needs an extra parameter specifying the filename and optional format\n");
                exit(1);
            }
            ++i;
            // Do we have the old or new style -o option?
            char *filename = new char[strlen(argv[i])+1];
            char *format = new char[strlen(argv[i])+1];
            if (std::sscanf(argv[i], "%[^,],%s", filename, format) == 1) {
                // Old-style
                logFilename = argv[i];
            } else {
                // New-style
                if (strcmp(format, "txt") == 0)
                    logFormat = QTestLog::Plain;
                else if (strcmp(format, "csv") == 0)
                    logFormat = QTestLog::CSV;
                else if (strcmp(format, "lightxml") == 0)
                    logFormat = QTestLog::LightXML;
                else if (strcmp(format, "xml") == 0)
                    logFormat = QTestLog::XML;
                else if (strcmp(format, "junitxml") == 0)
                    logFormat = QTestLog::JUnitXML;
                else if (strcmp(format, "xunitxml") == 0) {
                    std::fprintf(stderr, "WARNING: xunitxml is deprecated. Please use junitxml.\n");
                    logFormat = QTestLog::JUnitXML;
                } else if (strcmp(format, "teamcity") == 0)
                    logFormat = QTestLog::TeamCity;
                else if (strcmp(format, "tap") == 0)
                    logFormat = QTestLog::TAP;
                else {
                    std::fprintf(stderr, "output format must be one of txt, csv, lightxml, xml, tap, teamcity or junitxml\n");
                    exit(1);
                }
                if (strcmp(filename, "-") == 0 && QTestLog::loggerUsingStdout()) {
                    std::fprintf(stderr, "only one logger can log to stdout\n");
                    exit(1);
                }
                QTestLog::addLogger(QTestLog::LogMode(logFormat), filename);
            }
            delete [] filename;
            delete [] format;
        } else if (strcmp(argv[i], "-eventdelay") == 0) {
            if (i + 1 >= argc) {
                std::fprintf(stderr, "-eventdelay needs an extra parameter to indicate the delay(ms)\n");
                exit(1);
            } else {
                QTest::eventDelay = qToInt(argv[++i]);
            }
        } else if (strcmp(argv[i], "-keydelay") == 0) {
            if (i + 1 >= argc) {
                std::fprintf(stderr, "-keydelay needs an extra parameter to indicate the delay(ms)\n");
                exit(1);
            } else {
                QTest::keyDelay = qToInt(argv[++i]);
            }
        } else if (strcmp(argv[i], "-mousedelay") == 0) {
            if (i + 1 >= argc) {
                std::fprintf(stderr, "-mousedelay needs an extra parameter to indicate the delay(ms)\n");
                exit(1);
            } else {
                QTest::mouseDelay = qToInt(argv[++i]);
            }
        } else if (strcmp(argv[i], "-maxwarnings") == 0) {
            if (i + 1 >= argc) {
                std::fprintf(stderr, "-maxwarnings needs an extra parameter with the amount of warnings\n");
                exit(1);
            } else {
                QTestLog::setMaxWarnings(qToInt(argv[++i]));
            }
        } else if (strcmp(argv[i], "-repeat") == 0) {
            if (i + 1 >= argc) {
                std::fprintf(stderr, "-repeat needs an extra parameter for the number of repetitions\n");
                exit(1);
            } else {
                repetitions = qToInt(argv[++i]);
            }
        } else if (strcmp(argv[i], "-nocrashhandler") == 0) {
            QTest::Internal::noCrashHandler = true;
        } else if (strcmp(argv[i], "-skipblacklisted") == 0) {
            QTest::skipBlacklisted = true;
#if QT_CONFIG(valgrind)
        } else if (strcmp(argv[i], "-callgrind") == 0) {
            if (!QBenchmarkValgrindUtils::haveValgrind()) {
                std::fprintf(stderr,
                             "WARNING: Valgrind not found or too old. "
                             "Make sure it is installed and in your path. "
                             "Using the walltime measurer.\n");
            } else if (QFileInfo(QDir::currentPath()).isWritable()) {
                QBenchmarkGlobalData::current->setMode(
                    QBenchmarkGlobalData::CallgrindParentProcess);
            } else {
                std::fprintf(stderr,
                             "WARNING: Current directory not writable. "
                             "Using the walltime measurer.\n");
            }
        } else if (strcmp(argv[i], "-callgrindchild") == 0) { // "private" option
            QBenchmarkGlobalData::current->setMode(QBenchmarkGlobalData::CallgrindChildProcess);
            QBenchmarkGlobalData::current->callgrindOutFileBase =
                QBenchmarkValgrindUtils::outFileBase();
#endif
#ifdef QTESTLIB_USE_PERF_EVENTS
        } else if (strcmp(argv[i], "-perf") == 0) {
            if (QBenchmarkPerfEventsMeasurer::isAvailable()) {
                // perf available
                QBenchmarkGlobalData::current->setMode(QBenchmarkGlobalData::PerfCounter);
            } else {
                std::fprintf(stderr, "WARNING: Linux perf events not available. Using the walltime measurer.\n");
            }
        } else if (strcmp(argv[i], "-perfcounter") == 0) {
            if (i + 1 >= argc) {
                std::fprintf(stderr, "-perfcounter needs an extra parameter with the name of the counter\n");
                exit(1);
            } else {
                QBenchmarkPerfEventsMeasurer::setCounter(argv[++i]);
            }
        } else if (strcmp(argv[i], "-perfcounterlist") == 0) {
            QBenchmarkPerfEventsMeasurer::listCounters();
            exit(0);
#endif
#ifdef HAVE_TICK_COUNTER
        } else if (strcmp(argv[i], "-tickcounter") == 0) {
            QBenchmarkGlobalData::current->setMode(QBenchmarkGlobalData::TickCounter);
#endif
        } else if (strcmp(argv[i], "-eventcounter") == 0) {
            QBenchmarkGlobalData::current->setMode(QBenchmarkGlobalData::EventCounter);
        } else if (strcmp(argv[i], "-minimumvalue") == 0) {
            if (i + 1 >= argc) {
                std::fprintf(stderr, "-minimumvalue needs an extra parameter to indicate the minimum time(ms)\n");
                exit(1);
            } else {
                QBenchmarkGlobalData::current->walltimeMinimum = qToInt(argv[++i]);
            }
        } else if (strcmp(argv[i], "-minimumtotal") == 0) {
            if (i + 1 >= argc) {
                std::fprintf(stderr, "-minimumtotal needs an extra parameter to indicate the minimum total measurement\n");
                exit(1);
            } else {
                QBenchmarkGlobalData::current->minimumTotal = qToInt(argv[++i]);
            }
        } else if (strcmp(argv[i], "-iterations") == 0) {
            if (i + 1 >= argc) {
                std::fprintf(stderr, "-iterations needs an extra parameter to indicate the number of iterations\n");
                exit(1);
            } else {
                QBenchmarkGlobalData::current->iterationCount = qToInt(argv[++i]);
            }
        } else if (strcmp(argv[i], "-median") == 0) {
            if (i + 1 >= argc) {
                std::fprintf(stderr, "-median needs an extra parameter to indicate the number of median iterations\n");
                exit(1);
            } else {
                QBenchmarkGlobalData::current->medianIterationCount = qToInt(argv[++i]);
            }

        } else if (strcmp(argv[i], "-vb") == 0) {
            QBenchmarkGlobalData::current->verboseOutput = true;
#if defined(Q_OS_DARWIN)
        } else if (strncmp(argv[i], "-Apple", 6) == 0) {
            i += 1; // Skip Apple-specific user preferences
            continue;
# if defined(HAVE_XCTEST)
        } else if (int skip = QXcodeTestLogger::parseCommandLineArgument(argv[i])) {
            i += (skip - 1); // Eating argv[i] with a continue counts towards skips
            continue;
# endif
#endif
        } else if (argv[i][0] == '-') {
            std::fprintf(stderr, "Unknown option: '%s'\n\n%s", argv[i], testOptions);
            if (qml) {
                std::fprintf(stderr, "\nqmltest related options:\n"
                                     " -import    : Specify an import directory.\n"
                                     " -plugins   : Specify a directory where to search for plugins.\n"
                                     " -input     : Specify the root directory for test cases.\n");
            }

            std::fprintf(stderr, "\n"
                                 " -help      : This help\n");
            exit(1);
        } else {
            // We can't check the availability of test functions until
            // we load the QML files.  So just store the data for now.
            int colon = -1;
            int offset;
            for (offset = 0; argv[i][offset]; ++offset) {
                if (argv[i][offset] == ':') {
                    if (argv[i][offset + 1] == ':') {
                        // "::" is used as a test name separator.
                        // e.g. "ClickTests::test_click:row1".
                        ++offset;
                    } else {
                        colon = offset;
                        break;
                    }
                }
            }
            if (colon == -1) {
                QTest::testFunctions += QString::fromLatin1(argv[i]);
                QTest::testTags += QString();
            } else {
                QTest::testFunctions +=
                    QString::fromLatin1(argv[i], colon);
                QTest::testTags +=
                    QString::fromLatin1(argv[i] + colon + 1);
            }
        }
    }

    bool installedTestCoverage = installCoverageTool(QTestResult::currentAppName(), QTestResult::currentTestObjectName());
    QTestLog::setInstalledTestCoverage(installedTestCoverage);

    // If no loggers were created by the long version of the -o command-line
    // option, but a logger was requested via the old-style option, add it.
    const bool explicitLoggerRequested = logFormat != -1;
    if (!QTestLog::hasLoggers() && explicitLoggerRequested)
        QTestLog::addLogger(QTestLog::LogMode(logFormat), logFilename);

    bool addFallbackLogger = !explicitLoggerRequested;

#if defined(QT_USE_APPLE_UNIFIED_LOGGING)
    // Any explicitly requested loggers will be added by now, so we can check if they use stdout
    const bool safeToAddAppleLogger = !AppleUnifiedLogger::preventsStderrLogging() || !QTestLog::loggerUsingStdout();
    if (safeToAddAppleLogger && QAppleTestLogger::debugLoggingEnabled()) {
        QTestLog::addLogger(QTestLog::Apple, nullptr);
        if (AppleUnifiedLogger::preventsStderrLogging() && !logFilename)
            addFallbackLogger = false; // Prevent plain test logger fallback below
    }
#endif

    if (addFallbackLogger)
        QTestLog::addLogger(QTestLog::Plain, logFilename);

    if (repetitions != 1 && !QTestLog::isRepeatSupported()) {
        std::fprintf(stderr, "-repeat is only supported with plain text logger\n");
        exit(1);
    }
}